

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.hpp
# Opt level: O2

void libtorrent::aux::
     sorted_insert<libtorrent::aux::peer_connection*,libtorrent::aux::bt_peer_connection*>
               (vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                *container,bt_peer_connection *v)

{
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  __position;
  bt_peer_connection *local_20;
  bt_peer_connection *local_18;
  
  local_18 = v;
  __position = ::std::
               __lower_bound<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,libtorrent::aux::bt_peer_connection*,__gnu_cxx::__ops::_Iter_less_val>
                         ((container->
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          (container->
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish,&local_18);
  local_20 = local_18;
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  _M_insert_rval(container,(const_iterator)__position._M_current,(value_type *)&local_20);
  return;
}

Assistant:

void sorted_insert(std::vector<T>& container, U v)
	{
		auto i = std::lower_bound(container.begin(), container.end(), v);
		container.insert(i, v);
	}